

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs.c
# Opt level: O0

void thread_main(void *arg)

{
  uv_fs_cb p_Var1;
  int iVar2;
  bool local_122a;
  int64_t eval_b;
  int64_t eval_a;
  int uv_errno;
  ssize_t n;
  char buf [4096];
  uv_buf_t bufs [1];
  undefined1 local_1e0 [8];
  uv_fs_t req;
  thread_ctx *ctx;
  void *arg_local;
  
  buf._4088_8_ = uv_buf_init(&n,0x1000);
  req.bufsml[3].len = (size_t)arg;
  uv_barrier_wait(arg);
  uv_sleep(100);
  do {
    iVar2 = uv_fs_read(0,local_1e0,*(undefined4 *)(req.bufsml[3].len + 0x20),buf + 0xff8,1,
                       0xffffffffffffffff,0);
    p_Var1 = req.cb;
    uv_fs_req_cleanup(local_1e0);
    local_122a = true;
    if ((long)p_Var1 < 1) {
      local_122a = p_Var1 == (uv_fs_cb)0xffffffffffffffff && iVar2 == -4;
    }
  } while (local_122a);
  if (p_Var1 != (uv_fs_cb)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-set-non-blocking.c"
            ,0x31,"n","==","0",p_Var1,"==",0);
    abort();
  }
  return;
}

Assistant:

static void thread_main(void* arg) {
  const struct thread_ctx* ctx;
  int size;
  char* data;

  ctx = (struct thread_ctx*)arg;
  size = ctx->size;
  data = ctx->data;

  while (size > 0) {
    ssize_t result;
    int nbytes;
    nbytes = size < ctx->interval ? size : ctx->interval;
    if (ctx->doread) {
      result = write(ctx->fd, data, nbytes);
      /* Should not see EINTR (or other errors) */
      ASSERT_EQ(result, nbytes);
    } else {
      result = read(ctx->fd, data, nbytes);
      /* Should not see EINTR (or other errors),
       * but might get a partial read if we are faster than the writer
       */
      ASSERT(result > 0 && result <= nbytes);
    }

    pthread_kill(ctx->pid, SIGUSR1);
    size -= result;
    data += result;
  }
}